

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O0

int __thiscall
CVmHashEntryDict::add_entry(CVmHashEntryDict *this,vm_obj_id_t obj,vm_prop_id_t prop,int from_image)

{
  vm_dict_entry *this_00;
  int in_ECX;
  vm_prop_id_t in_DX;
  vm_obj_id_t in_ESI;
  long in_RDI;
  vm_dict_entry *prv;
  vm_dict_entry *entry;
  vm_obj_id_t *local_30;
  vm_obj_id_t *local_28;
  
  local_30 = (vm_obj_id_t *)0x0;
  local_28 = *(vm_obj_id_t **)(in_RDI + 0x28);
  while( true ) {
    if (local_28 == (vm_obj_id_t *)0x0) {
      this_00 = (vm_dict_entry *)operator_new(0x18);
      vm_dict_entry::vm_dict_entry(this_00,in_ESI,in_DX,in_ECX);
      if (local_30 == (vm_obj_id_t *)0x0) {
        this_00->nxt_ = *(vm_dict_entry **)(in_RDI + 0x28);
        *(vm_dict_entry **)(in_RDI + 0x28) = this_00;
      }
      else {
        this_00->nxt_ = *(vm_dict_entry **)(local_30 + 2);
        *(vm_dict_entry **)(local_30 + 2) = this_00;
      }
      return 1;
    }
    if ((*local_28 == in_ESI) && ((vm_prop_id_t)local_28[1] == in_DX)) break;
    if ((vm_prop_id_t)local_28[1] == in_DX) {
      local_30 = local_28;
    }
    local_28 = *(vm_obj_id_t **)(local_28 + 2);
  }
  return 0;
}

Assistant:

int add_entry(vm_obj_id_t obj, vm_prop_id_t prop, int from_image)
    {
        vm_dict_entry *entry;
        vm_dict_entry *prv;

        /* 
         *   check to see if this entry is already in our list - if it is,
         *   don't bother adding the redundant definition 
         */
        for (prv = 0, entry = list_ ; entry != 0 ; entry = entry->nxt_)
        {
            /* 
             *   if this entry matches the object ID and property ID,
             *   ignore the addition 
             */
            if (entry->obj_ == obj && entry->prop_ == prop)
                return FALSE;

            /* 
             *   if this entry matches the property, remember it as the
             *   insertion point, so that we keep all definitions for the
             *   same word with the same property together in the list 
             */
            if (entry->prop_ == prop)
                prv = entry;
        }

        /* create a list entry */
        entry = new vm_dict_entry(obj, prop, from_image);

        /* 
         *   link it in after the insertion point, or at the head of our
         *   list if we didn't find any other insertion point 
         */
        if (prv != 0)
        {
            /* we found an insertion point - link it in */
            entry->nxt_ = prv->nxt_;
            prv->nxt_ = entry;
        }
        else
        {
            /* no insertion point - link it at the head of our list */
            entry->nxt_ = list_;
            list_ = entry;
        }

        /* we added the entry */
        return TRUE;
    }